

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printBarrierOption(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  char *local_38;
  char *Name;
  uint local_28;
  uint32_t uStack_24;
  _Bool Valid;
  uint Opcode;
  uint Val;
  SStream *O_local;
  MCInst *pMStack_10;
  uint OpNo_local;
  MCInst *MI_local;
  
  _Opcode = O;
  O_local._4_4_ = OpNo;
  pMStack_10 = MI;
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  uStack_24 = (uint32_t)iVar3;
  local_28 = MCInst_getOpcode(pMStack_10);
  if (local_28 == 0x2d8) {
    local_38 = A64NamedImmMapper_toString(&A64ISB_ISBMapper,uStack_24,(_Bool *)((long)&Name + 7));
  }
  else {
    local_38 = A64NamedImmMapper_toString
                         (&A64DB_DBarrierMapper,uStack_24,(_Bool *)((long)&Name + 7));
  }
  if ((Name._7_1_ & 1) == 0) {
    printUInt32Bang(_Opcode,uStack_24);
    if (pMStack_10->csh->detail != CS_OPT_OFF) {
      puVar1 = pMStack_10->flat_insn->detail->groups +
               (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(ulong *)(pMStack_10->flat_insn->detail->groups +
                (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
           (ulong)uStack_24;
      pcVar2 = pMStack_10->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  else {
    SStream_concat0(_Opcode,local_38);
    if (pMStack_10->csh->detail != CS_OPT_OFF) {
      puVar1 = pMStack_10->flat_insn->detail->groups +
               (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = 'F';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint32_t *)
       (pMStack_10->flat_insn->detail->groups +
       (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uStack_24;
      pcVar2 = pMStack_10->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  return;
}

Assistant:

static void printBarrierOption(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	unsigned Opcode = MCInst_getOpcode(MI);
	bool Valid;
	char *Name;

	if (Opcode == AArch64_ISB)
		Name = A64NamedImmMapper_toString(&A64ISB_ISBMapper, Val, &Valid);
	else
		Name = A64NamedImmMapper_toString(&A64DB_DBarrierMapper, Val, &Valid);

	if (Valid) {
		SStream_concat0(O, Name);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_BARRIER;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].barrier = Val;
			MI->flat_insn->detail->arm64.op_count++;
		}
	} else {
		printUInt32Bang(O, Val);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Val;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}